

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O0

ssize_t __thiscall DoubleElement::read(DoubleElement *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  int iVar2;
  char *__nptr;
  ostream *poVar3;
  undefined8 uVar4;
  undefined4 in_register_00000034;
  string local_98;
  string local_78;
  double local_58;
  double tmpVal;
  undefined1 local_40 [8];
  string tmpStr;
  stringstream *f_local;
  DoubleElement *this_local;
  
  tmpStr.field_2._8_8_ = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string((string *)local_40);
  std::operator>>((istream *)tmpStr.field_2._8_8_,(string *)local_40);
  __nptr = (char *)std::__cxx11::string::c_str();
  local_58 = atof(__nptr);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"0");
  if (((!bVar1) || (local_58 != 0.0)) || (NAN(local_58))) {
    this->_value = local_58;
    Object::setInitState(&(this->super_StreamObject).super_Object,true);
    this_local._7_1_ = 1;
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error (DoubleElement): Entry ");
    iVar2 = StreamObject::getOffset(&this->super_StreamObject);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2 + 1);
    poVar3 = std::operator<<(poVar3," in \"<");
    StreamObject::getParentName_abi_cxx11_(&local_78,&this->super_StreamObject);
    poVar3 = std::operator<<(poVar3,(string *)&local_78);
    poVar3 = std::operator<<(poVar3,"></");
    StreamObject::getParentName_abi_cxx11_(&local_98,&this->super_StreamObject);
    poVar3 = std::operator<<(poVar3,(string *)&local_98);
    std::operator<<(poVar3,">\" - Section is not a valid double number!\n");
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
    this_local._7_1_ = 0;
  }
  uVar4 = std::__cxx11::string::~string((string *)local_40);
  return CONCAT71((int7)((ulong)uVar4 >> 8),this_local._7_1_);
}

Assistant:

bool DoubleElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read real number
	------------------------------------------*/
	std::string tmpStr;
	f >> tmpStr;


	double tmpVal = atof( tmpStr.c_str() );
	if (( tmpStr != "0" ) && ( tmpVal == 0 ) )
	{
		std::cerr << "Error (DoubleElement): Entry " << getOffset() + 1 << " in \"<"
		<< getParentName() << "></" << getParentName() << ">\" - Section is not a valid double number!\n";
		return false;
	}
	_value = tmpVal;

	setInitState( true );

	return true;

}